

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexEntries(DWARFVerifier *this,NameIndex *NI,NameTableEntry *NTE)

{
  undefined1 *this_00;
  uint64_t *puVar1;
  undefined1 auVar2 [8];
  char cVar3;
  short sVar4;
  uint uVar5;
  raw_ostream *prVar6;
  ErrorInfoBase *pEVar7;
  StringRef *pSVar8;
  ErrorInfoBase EVar9;
  undefined1 in_R8B;
  DWARFUnit *pDVar10;
  uint64_t *puVar11;
  Optional<unsigned_long> OVar12;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Fmt_01;
  StringRef Fmt_02;
  StringRef Fmt_03;
  StringRef Fmt_04;
  undefined1 local_2c8 [8];
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  NameTableEntry **local_200;
  void *local_1f8;
  NameTableEntry *local_1f0;
  format_adapter **local_1e8;
  uint *local_1e0;
  long local_1d0;
  byte local_150;
  undefined **local_148;
  undefined **local_140;
  NameTableEntry *local_138;
  undefined **local_130;
  undefined **local_128;
  format_adapter *local_120;
  StringRef Str;
  uint64_t NextEntryID;
  undefined1 local_100 [8];
  SmallVector<llvm::StringRef,_2U> EntryNames;
  int local_74;
  Error EStack_70;
  uint NumEntries;
  uint64_t CUOffset;
  DWARFDie DIE;
  uint64_t EntryID;
  uint64_t DIEOffset;
  uint32_t CUIndex;
  uint local_34 [2];
  uint NumErrors;
  
  uVar5 = 0;
  if ((NI->Hdr).super_HeaderPOD.LocalTypeUnitCount + (NI->Hdr).super_HeaderPOD.ForeignTypeUnitCount
      == 0) {
    local_2c8 = (undefined1  [8])NTE->StringOffset;
    local_120 = (format_adapter *)DataExtractor::getCStr(&NTE->StrData,(uint64_t *)local_2c8);
    if (local_120 == (format_adapter *)0x0) {
      prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,(StringRef)ZEXT816(0),
                                (bool)in_R8B);
      local_1f0 = (NameTableEntry *)NI->Base;
      EntryOr._184_8_ = &PTR_anchor_010989a8;
      Fmt.Length = 0x43;
      Fmt.Data = "Name Index @ {0:x}: Unable to get string associated with name {1}.\n";
      formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
      ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                        *)local_2c8,Fmt,
                       (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>_>
                        *)&EntryOr.field_0xb8);
      raw_ostream::operator<<(prVar6,(formatv_object_base *)local_2c8);
      if (EntryOr.field_0._32_8_ != 0) {
        operator_delete((void *)EntryOr.field_0._32_8_,
                        EntryOr.field_0._48_8_ - EntryOr.field_0._32_8_);
      }
      if (EntryOr.field_0._8_8_ != 0) {
        operator_delete((void *)EntryOr.field_0._8_8_,EntryOr.field_0._24_8_ - EntryOr.field_0._8_8_
                       );
      }
      uVar5 = 1;
    }
    else {
      Str.Data = (char *)strlen((char *)local_120);
      local_34[0] = 0;
      local_74 = 0;
      Str.Length = NTE->EntryOffset;
      local_138 = NTE;
      DIE.Die = (DWARFDebugInfoEntry *)Str.Length;
      DWARFDebugNames::NameIndex::getEntry
                ((Expected<llvm::DWARFDebugNames::Entry> *)local_2c8,NI,&Str.Length);
      if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
        local_148 = &PTR_anchor_01098bf8;
        _CUIndex = &PTR_anchor_01098918;
        local_130 = &PTR_anchor_01098d18;
        local_128 = &PTR_anchor_01098d48;
        local_140 = &PTR_anchor_01097d20;
        this_00 = &EntryOr.field_0xb8;
        do {
          OVar12 = DWARFDebugNames::Entry::getCUIndex((Entry *)local_2c8);
          if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00d9b491:
            __assert_fail("hasVal",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                          ,0xad,
                          "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                         );
          }
          uVar5 = OVar12.Storage.field_0._0_4_;
          DIEOffset = CONCAT44(DIEOffset._4_4_,uVar5);
          if ((NI->Hdr).super_HeaderPOD.CompUnitCount < uVar5) {
            prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_ =
                 local_148;
            Fmt_00.Length = 0x46;
            Fmt_00.Data = "Name Index @ {0:x}: Entry @ {1:x} contains an invalid CU index ({2}).\n";
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
            ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
                              *)this_00,Fmt_00,
                             (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                              *)(EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts
                                 [1].buffer + 8));
            raw_ostream::operator<<(prVar6,(formatv_object_base *)this_00);
LAB_00d9b013:
            if (local_1e0 != (uint *)0x0) {
              operator_delete(local_1e0,local_1d0 - (long)local_1e0);
            }
            if (local_1f8 != (void *)0x0) {
              operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
            }
            local_34[0] = local_34[0] + 1;
          }
          else {
            pEVar7 = (ErrorInfoBase *)DWARFDebugNames::NameIndex::getCUOffset(NI,uVar5);
            EStack_70.Payload = pEVar7;
            if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) != 0) goto LAB_00d9b4b0;
            OVar12 = DWARFDebugNames::Entry::getDIEUnitOffset((Entry *)local_2c8);
            if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            goto LAB_00d9b491;
            EntryID = (long)&pEVar7->_vptr_ErrorInfoBase + OVar12.Storage.field_0.value;
            _CUOffset = DWARFContext::getDIEForOffset(this->DCtx,EntryID);
            if (CUOffset == (DWARFUnit *)0x0 || CUOffset._8_8_ == (DWARFDebugInfoEntry *)0x0) {
              prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_ =
                   &PTR_anchor_01098ba8;
              Fmt_02.Length = 0x49;
              Fmt_02.Data = 
              "Name Index @ {0:x}: Entry @ {1:x} references a non-existing DIE @ {2:x}.\n";
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
              ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                                *)this_00,Fmt_02,
                               (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
                                *)(EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.
                                   InlineElts[1].buffer + 8));
              raw_ostream::operator<<(prVar6,(formatv_object_base *)this_00);
              goto LAB_00d9b013;
            }
            if ((ErrorInfoBase *)(CUOffset->Header).Offset != EStack_70.Payload) {
              prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_ =
                   _CUIndex;
              Fmt_01.Length = 100;
              Fmt_01.Data = 
              "Name Index @ {0:x}: Entry @ {1:x}: mismatched CU of DIE @ {2:x}: index - {3:x}; debug_info - {4:x}.\n"
              ;
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
              ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
                                *)this_00,Fmt_01,
                               (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
                                *)(EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.
                                   InlineElts[1].buffer + 8));
              raw_ostream::operator<<(prVar6,(formatv_object_base *)this_00);
              if (local_1e0 != (uint *)0x0) {
                operator_delete(local_1e0,local_1d0 - (long)local_1e0);
              }
              if (local_1f8 != (void *)0x0) {
                operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
              }
              local_34[0] = local_34[0] + 1;
            }
            if ((CUOffset == 0) || (DIE.U == (DWARFUnit *)0x0)) {
LAB_00d9b4cf:
              __assert_fail("isValid() && \"must check validity prior to calling\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                            ,0x3b,
                            "const DWARFAbbreviationDeclaration *llvm::DWARFDie::getAbbreviationDeclarationPtr() const"
                           );
            }
            if ((DIE.U)->InfoSection == (DWARFSection *)0x0) {
              sVar4 = 0;
            }
            else {
              sVar4 = *(short *)((long)&((DIE.U)->InfoSection->Data).Data + 4);
            }
            if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) != 0) {
LAB_00d9b4b0:
              __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                            ,0x272,
                            "storage_type *llvm::Expected<llvm::DWARFDebugNames::Entry>::getStorage() [T = llvm::DWARFDebugNames::Entry]"
                           );
            }
            if (sVar4 != *(short *)(EntryOr.field_0._168_8_ + 4)) {
              prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) != 0) goto LAB_00d9b4b0;
              if ((CUOffset == 0) || (DIE.U == (DWARFUnit *)0x0)) goto LAB_00d9b4cf;
              EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_ =
                   local_140;
              Fmt_03.Length = 0x61;
              Fmt_03.Data = 
              "Name Index @ {0:x}: Entry @ {1:x}: mismatched Tag of DIE @ {2:x}: index - {3}; debug_info - {4}.\n"
              ;
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>
              ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>
                                *)this_00,Fmt_03,
                               (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>
                                *)(EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.
                                   InlineElts[1].buffer + 8));
              raw_ostream::operator<<(prVar6,(formatv_object_base *)this_00);
              if (local_1e0 != (uint *)0x0) {
                operator_delete(local_1e0,local_1d0 - (long)local_1e0);
              }
              if (local_1f8 != (void *)0x0) {
                operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
              }
              local_34[0] = local_34[0] + 1;
            }
            getNames((SmallVector<llvm::StringRef,_2U> *)local_100,(DWARFDie *)&CUOffset,true);
            pSVar8 = std::
                     __find_if<llvm::StringRef*,__gnu_cxx::__ops::_Iter_equals_val<llvm::StringRef_const>>
                               (local_100,
                                (_func_int **)
                                ((long)local_100 +
                                (ulong)(uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                                             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                             super_SmallVectorBase.BeginX * 2 * 8),&local_120);
            if (pSVar8 == (StringRef *)
                          ((ulong)(uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                                        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                        super_SmallVectorBase.BeginX * 0x10 + (long)local_100)) {
              prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_ =
                   local_130;
              Fmt_04.Length = 0x62;
              Fmt_04.Data = 
              "Name Index @ {0:x}: Entry @ {1:x}: mismatched Name of DIE @ {2:x}: index - {3}; debug_info - {4}.\n"
              ;
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>_>
              ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>_>
                                *)this_00,Fmt_04,
                               (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
                                *)(EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.
                                   InlineElts[1].buffer + 8));
              raw_ostream::operator<<(prVar6,(formatv_object_base *)this_00);
              if (local_1e0 != (uint *)0x0) {
                operator_delete(local_1e0,local_1d0 - (long)local_1e0);
              }
              if (local_1f8 != (void *)0x0) {
                operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
              }
              local_34[0] = local_34[0] + 1;
            }
            if (local_100 !=
                (undefined1  [8])
                &EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                 super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size)
            {
              free((void *)local_100);
            }
          }
          local_74 = local_74 + 1;
          DIE.Die = (DWARFDebugInfoEntry *)Str.Length;
          DWARFDebugNames::NameIndex::getEntry
                    ((Expected<llvm::DWARFDebugNames::Entry> *)this_00,NI,&Str.Length);
          if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
            local_2c8 = (undefined1  [8])&PTR___cxa_pure_virtual_01097f30;
            if (EntryOr.field_0.ErrorStorage.buffer !=
                (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
                 )((long)&EntryOr.field_0 + 0x10)) {
              free((void *)EntryOr.field_0.ErrorStorage.buffer);
            }
          }
          else {
            if ((char  [8])local_2c8 != (char  [8])0x0) {
              (**(code **)(*(undefined **)local_2c8 + 8))();
            }
            local_2c8[0] = '\0';
            local_2c8[1] = '\0';
            local_2c8[2] = '\0';
            local_2c8[3] = '\0';
            local_2c8[4] = '\0';
            local_2c8[5] = '\0';
            local_2c8[6] = '\0';
            local_2c8[7] = '\0';
          }
          Expected<llvm::DWARFDebugNames::Entry>::moveConstruct<llvm::DWARFDebugNames::Entry>
                    ((Expected<llvm::DWARFDebugNames::Entry> *)local_2c8,
                     (Expected<llvm::DWARFDebugNames::Entry> *)this_00);
          if ((local_150 & 1) == 0) {
            EntryOr._184_8_ = &PTR___cxa_pure_virtual_01097f30;
            if (local_200 != &local_1f0) {
              free(local_200);
            }
          }
          else {
            if (EntryOr._184_8_ != 0) {
              (**(code **)(*(long *)EntryOr._184_8_ + 8))();
            }
            EntryOr._184_8_ = 0;
          }
        } while ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0);
      }
      auVar2 = local_2c8;
      local_2c8[0] = '\0';
      local_2c8[1] = '\0';
      local_2c8[2] = '\0';
      local_2c8[3] = '\0';
      local_2c8[4] = '\0';
      local_2c8[5] = '\0';
      local_2c8[6] = '\0';
      local_2c8[7] = '\0';
      EntryOr._184_8_ = &local_74;
      local_1f0 = local_138;
      local_1e8 = &local_120;
      local_1e0 = local_34;
      EVar9._vptr_ErrorInfoBase = (_func_int **)((ulong)auVar2 & 0xfffffffffffffffe);
      EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_ = this;
      if ((NameIndex *)EVar9._vptr_ErrorInfoBase == (NameIndex *)0x0) {
        DIEOffset = 1;
      }
      else {
        cVar3 = (**(code **)(*EVar9._vptr_ErrorInfoBase + 0x30))(EVar9._vptr_ErrorInfoBase);
        if (cVar3 == '\0') {
          local_100 = (undefined1  [8])EVar9._vptr_ErrorInfoBase;
          handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
                    ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                     &DIEOffset,(anon_class_48_6_0fa2c5c1 *)local_100,
                     (anon_class_40_5_28e94b40 *)&EntryOr.field_0xb8);
          if (local_100 != (undefined1  [8])0x0) {
            (**(code **)(*(undefined **)local_100 + 8))();
          }
          local_100 = (undefined1  [8])0x0;
          EVar9._vptr_ErrorInfoBase = (_func_int **)(NameIndex *)0x0;
          pDVar10 = (DWARFUnit *)DIEOffset;
        }
        else {
          DIEOffset = 1;
          puVar11 = (uint64_t *)EVar9._vptr_ErrorInfoBase[1];
          puVar1 = (uint64_t *)EVar9._vptr_ErrorInfoBase[2];
          pDVar10 = (DWARFUnit *)0x1;
          _CUIndex = EVar9._vptr_ErrorInfoBase;
          if (puVar11 != puVar1) {
            do {
              CUOffset = (uint64_t)pDVar10;
              EntryID = *puVar11;
              *puVar11 = 0;
              handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
                        ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                          *)&stack0xffffffffffffff90,(anon_class_48_6_0fa2c5c1 *)&EntryID,
                         (anon_class_40_5_28e94b40 *)&EntryOr.field_0xb8);
              ErrorList::join((ErrorList *)local_100,(Error *)&CUOffset,&stack0xffffffffffffff90);
              auVar2 = local_100;
              local_100 = (undefined1  [8])0x0;
              if ((long *)((ulong)EStack_70.Payload & 0xfffffffffffffffe) != (long *)0x0) {
                (**(code **)(*(long *)((ulong)EStack_70.Payload & 0xfffffffffffffffe) + 8))();
              }
              if (EntryID != 0) {
                (**(code **)(*(long *)EntryID + 8))();
              }
              EntryID = 0;
              if (((undefined1  [16])_CUOffset & (undefined1  [16])0xfffffffffffffffe) !=
                  (undefined1  [16])0x0) {
                (**(code **)(*(long *)(CUOffset & 0xfffffffffffffffe) + 8))();
              }
              pDVar10 = (DWARFUnit *)((ulong)auVar2 | 1);
              puVar11 = puVar11 + 1;
              EVar9._vptr_ErrorInfoBase = (_func_int **)_CUIndex;
            } while (puVar11 != puVar1);
          }
        }
        DIEOffset = (uint64_t)pDVar10;
        if ((NameIndex *)EVar9._vptr_ErrorInfoBase != (NameIndex *)0x0) {
          (**(code **)&(((((NameIndex *)EVar9._vptr_ErrorInfoBase)->Abbrevs).
                         super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                         .TheMap.Buckets)->key).Attributes.
                       super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                       ._M_impl.super__Vector_impl_data)();
        }
      }
      cantFail((Error *)&DIEOffset,(char *)0x0);
      if ((long *)(DIEOffset & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(DIEOffset & 0xfffffffffffffffe) + 8))();
      }
      uVar5 = local_34[0];
      if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
        local_2c8 = (undefined1  [8])&PTR___cxa_pure_virtual_01097f30;
        if (EntryOr.field_0.ErrorStorage.buffer !=
            (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
             )((long)&EntryOr.field_0 + 0x10)) {
          free((void *)EntryOr.field_0.ErrorStorage.buffer);
        }
      }
      else if ((char  [8])local_2c8 != (char  [8])0x0) {
        (**(code **)(*(long *)local_2c8 + 8))();
      }
    }
  }
  return uVar5;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexEntries(
    const DWARFDebugNames::NameIndex &NI,
    const DWARFDebugNames::NameTableEntry &NTE) {
  // Verifying type unit indexes not supported.
  if (NI.getLocalTUCount() + NI.getForeignTUCount() > 0)
    return 0;

  const char *CStr = NTE.getString();
  if (!CStr) {
    error() << formatv(
        "Name Index @ {0:x}: Unable to get string associated with name {1}.\n",
        NI.getUnitOffset(), NTE.getIndex());
    return 1;
  }
  StringRef Str(CStr);

  unsigned NumErrors = 0;
  unsigned NumEntries = 0;
  uint64_t EntryID = NTE.getEntryOffset();
  uint64_t NextEntryID = EntryID;
  Expected<DWARFDebugNames::Entry> EntryOr = NI.getEntry(&NextEntryID);
  for (; EntryOr; ++NumEntries, EntryID = NextEntryID,
                                EntryOr = NI.getEntry(&NextEntryID)) {
    uint32_t CUIndex = *EntryOr->getCUIndex();
    if (CUIndex > NI.getCUCount()) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x} contains an "
                         "invalid CU index ({2}).\n",
                         NI.getUnitOffset(), EntryID, CUIndex);
      ++NumErrors;
      continue;
    }
    uint64_t CUOffset = NI.getCUOffset(CUIndex);
    uint64_t DIEOffset = CUOffset + *EntryOr->getDIEUnitOffset();
    DWARFDie DIE = DCtx.getDIEForOffset(DIEOffset);
    if (!DIE) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x} references a "
                         "non-existing DIE @ {2:x}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset);
      ++NumErrors;
      continue;
    }
    if (DIE.getDwarfUnit()->getOffset() != CUOffset) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched CU of "
                         "DIE @ {2:x}: index - {3:x}; debug_info - {4:x}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, CUOffset,
                         DIE.getDwarfUnit()->getOffset());
      ++NumErrors;
    }
    if (DIE.getTag() != EntryOr->tag()) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched Tag of "
                         "DIE @ {2:x}: index - {3}; debug_info - {4}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, EntryOr->tag(),
                         DIE.getTag());
      ++NumErrors;
    }

    auto EntryNames = getNames(DIE);
    if (!is_contained(EntryNames, Str)) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched Name "
                         "of DIE @ {2:x}: index - {3}; debug_info - {4}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, Str,
                         make_range(EntryNames.begin(), EntryNames.end()));
      ++NumErrors;
    }
  }
  handleAllErrors(EntryOr.takeError(),
                  [&](const DWARFDebugNames::SentinelError &) {
                    if (NumEntries > 0)
                      return;
                    error() << formatv("Name Index @ {0:x}: Name {1} ({2}) is "
                                       "not associated with any entries.\n",
                                       NI.getUnitOffset(), NTE.getIndex(), Str);
                    ++NumErrors;
                  },
                  [&](const ErrorInfoBase &Info) {
                    error()
                        << formatv("Name Index @ {0:x}: Name {1} ({2}): {3}\n",
                                   NI.getUnitOffset(), NTE.getIndex(), Str,
                                   Info.message());
                    ++NumErrors;
                  });
  return NumErrors;
}